

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O2

void satoko_rollback(satoko_t *s)

{
  uint uVar1;
  byte *pbVar2;
  uint uVar3;
  void *__ptr;
  uint *puVar4;
  watch_list *pwVar5;
  int iVar6;
  vec_uint_t *p;
  ulong uVar7;
  ulong uVar8;
  
  if (s->status != 1) {
    __assert_fail("s->status == SATOKO_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x204,"void satoko_rollback(satoko_t *)");
  }
  if (s->trail_lim->size != 0) {
    __assert_fail("solver_dlevel(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x205,"void satoko_rollback(satoko_t *)");
  }
  if (s->book_vars == 0) {
    satoko_reset(s);
    return;
  }
  p = s->originals;
  uVar3 = p->size;
  uVar1 = s->book_cl_orig;
  iVar6 = uVar3 - uVar1;
  uVar7 = (ulong)((s->learnts->size - s->book_cl_lrnt) + iVar6);
  __ptr = malloc(uVar7 * 8);
  for (uVar8 = (ulong)uVar1; uVar8 < uVar3; uVar8 = uVar8 + 1) {
    uVar3 = vec_uint_at(p,(uint)uVar8);
    if (uVar3 == 0xffffffff) {
      puVar4 = (uint *)0x0;
    }
    else {
      puVar4 = s->all_clauses->data + uVar3;
    }
    *(uint **)((long)__ptr + uVar8 * 8) = puVar4;
    p = s->originals;
    uVar3 = p->size;
  }
  for (uVar8 = (ulong)s->book_cl_lrnt; uVar8 < s->learnts->size; uVar8 = uVar8 + 1) {
    uVar3 = vec_uint_at(s->learnts,(uint)uVar8);
    if (uVar3 == 0xffffffff) {
      puVar4 = (uint *)0x0;
    }
    else {
      puVar4 = s->all_clauses->data + uVar3;
    }
    *(uint **)((long)__ptr + (ulong)(iVar6 + (uint)uVar8) * 8) = puVar4;
  }
  for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    pbVar2 = *(byte **)((long)__ptr + uVar8 * 8);
    clause_unwatch(s,(uint)((ulong)((long)pbVar2 - (long)s->all_clauses->data) >> 2));
    *pbVar2 = *pbVar2 | 2;
  }
  free(__ptr);
  vec_uint_shrink(s->originals,s->book_cl_orig);
  vec_uint_shrink(s->learnts,s->book_cl_lrnt);
  for (uVar3 = s->book_vars; uVar3 < s->assigns->size * 2; uVar3 = uVar3 + 1) {
    pwVar5 = vec_wl_at(s->watches,uVar3);
    pwVar5->size = 0;
    pwVar5 = vec_wl_at(s->watches,uVar3);
    pwVar5->n_bin = 0;
  }
  uVar3 = s->book_vars;
  s->watches->size = uVar3;
  if (uVar3 <= s->activity->cap) {
    s->activity->size = uVar3;
    vec_uint_shrink(s->levels,uVar3);
    vec_uint_shrink(s->reasons,s->book_vars);
    vec_uint_shrink(s->stamps,s->book_vars);
    vec_char_shrink(s->assigns,s->book_vars);
    vec_char_shrink(s->seen,s->book_vars);
    vec_char_shrink(s->polarity,s->book_vars);
    solver_rebuild_order(s);
    solver_cancel_until(s,0);
    vec_uint_shrink(s->trail,s->book_trail);
    if (s->book_cdb != 0) {
      s->all_clauses->size = s->book_cdb;
    }
    s->book_cl_orig = 0;
    s->book_cl_lrnt = 0;
    s->book_vars = 0;
    s->book_trail = 0;
    return;
  }
  __assert_fail("new_size <= p->cap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_sdbl.h"
                ,0x5b,"void vec_sdbl_shrink(vec_sdbl_t *, unsigned int)");
}

Assistant:

void satoko_rollback(satoko_t *s)
{
    unsigned i, cref;
    unsigned n_originals = vec_uint_size(s->originals) - s->book_cl_orig;
    unsigned n_learnts = vec_uint_size(s->learnts) - s->book_cl_lrnt;
    struct clause **cl_to_remove;

    // printf("[Satoko] rollback.\n");
    assert(s->status == SATOKO_OK);
    assert(solver_dlevel(s) == 0);
    if (!s->book_vars) {
        satoko_reset(s);
        return;
    }
    cl_to_remove = satoko_alloc(struct clause *, n_originals + n_learnts);
    /* Mark clauses */
    vec_uint_foreach_start(s->originals, cref, i, s->book_cl_orig)
        cl_to_remove[i] = clause_fetch(s, cref);
    vec_uint_foreach_start(s->learnts, cref, i, s->book_cl_lrnt)
        cl_to_remove[n_originals + i] = clause_fetch(s, cref);
    for (i = 0; i < n_originals + n_learnts; i++) {
        clause_unwatch(s, cdb_cref(s->all_clauses, (unsigned *)cl_to_remove[i]));
        cl_to_remove[i]->f_mark = 1;
    }
    satoko_free(cl_to_remove);
    vec_uint_shrink(s->originals, s->book_cl_orig);
    vec_uint_shrink(s->learnts, s->book_cl_lrnt);
    /* Shrink variable related vectors */
    for (i = s->book_vars; i < 2 * vec_char_size(s->assigns); i++) {
        vec_wl_at(s->watches, i)->size = 0;
        vec_wl_at(s->watches, i)->n_bin = 0;
    }
    // s->i_qhead = s->book_qhead;
    s->watches->size = s->book_vars;
    vec_act_shrink(s->activity, s->book_vars);
    vec_uint_shrink(s->levels, s->book_vars);
    vec_uint_shrink(s->reasons, s->book_vars);
    vec_uint_shrink(s->stamps, s->book_vars);
    vec_char_shrink(s->assigns, s->book_vars);
    vec_char_shrink(s->seen, s->book_vars);
    vec_char_shrink(s->polarity, s->book_vars);
    solver_rebuild_order(s);
    /* Rewind solver and cancel level 0 assignments to the trail */
    solver_cancel_until(s, 0);
    vec_uint_shrink(s->trail, s->book_trail);
    if (s->book_cdb)
        s->all_clauses->size = s->book_cdb;
    s->book_cl_orig = 0;
    s->book_cl_lrnt = 0;
    s->book_vars = 0;
    s->book_trail = 0;
    // s->book_qhead = 0;
}